

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O2

void __thiscall ScriptOperator_operator_3_Test::TestBody(ScriptOperator_operator_3_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_70;
  AssertionResult gtest_ar_;
  ScriptOperator script_op;
  
  cfd::core::ScriptOperator::ScriptOperator
            (&script_op,(ScriptOperator *)cfd::core::ScriptOperator::OP_NEGATE);
  bVar1 = cfd::core::ScriptOperator::operator!=
                    (&script_op,(ScriptOperator *)cfd::core::ScriptOperator::OP_NEGATE);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar_,
               (AssertionResult *)"script_op != ScriptOperator::OP_NEGATE","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x36,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       cfd::core::ScriptOperator::operator!=
                 (&script_op,(ScriptOperator *)cfd::core::ScriptOperator::OP_SHA1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar_,
               (AssertionResult *)"script_op != ScriptOperator::OP_SHA1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x37,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = cfd::core::ScriptOperator::IsPushOperator(&script_op);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar_,(AssertionResult *)"script_op.IsPushOperator()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x38,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::ScriptOperator::~ScriptOperator(&script_op);
  return;
}

Assistant:

TEST(ScriptOperator, operator_3) {
  ScriptOperator script_op(ScriptOperator::OP_NEGATE);

  EXPECT_FALSE(script_op != ScriptOperator::OP_NEGATE);
  EXPECT_TRUE(script_op != ScriptOperator::OP_SHA1);
  EXPECT_FALSE(script_op.IsPushOperator());
}